

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upsync_module.c
# Opt level: O0

void ngx_http_upsync_begin_handler(ngx_event_t *event)

{
  void *pvVar1;
  ngx_int_t nVar2;
  long *__s;
  ngx_http_upsync_server_t *upsync_server;
  ngx_http_upsync_ctx_t *ctx;
  ngx_event_t *event_local;
  
  nVar2 = ngx_http_upsync_need_exit();
  if (nVar2 == 0) {
    pvVar1 = event->data;
    if (pvVar1 == (void *)0x0) {
      if (3 < ngx_cycle->log->log_level) {
        ngx_log_error_core(4,ngx_cycle->log,0,"ngx_http_upsync_begin_handler: upsync_server is null"
                          );
      }
    }
    else {
      __s = (long *)((long)pvVar1 + 0x170);
      if (*__s != 0) {
        ngx_destroy_pool((ngx_pool_t *)*__s);
      }
      *__s = 0;
      memset(__s,0,0x170);
      if (parser != (http_parser *)0x0) {
        free(parser);
        parser = (http_parser *)0x0;
      }
      if ((*(uint *)((long)pvVar1 + 0x28) >> 0xb & 1) != 0) {
        ngx_event_del_timer((ngx_event_t *)((long)pvVar1 + 0x20));
      }
      ngx_http_upsync_connect_handler(event);
    }
  }
  return;
}

Assistant:

static void
ngx_http_upsync_begin_handler(ngx_event_t *event)
{
    ngx_http_upsync_ctx_t          *ctx;
    ngx_http_upsync_server_t       *upsync_server;

    if (ngx_http_upsync_need_exit()) {
        return;
    }

    upsync_server = event->data;
    if (upsync_server == NULL) {
        ngx_log_error(NGX_LOG_ERR, ngx_cycle->log, 0,
                      "ngx_http_upsync_begin_handler: upsync_server is null");
        return;
    }

    ctx = &upsync_server->ctx;
    if (ctx->pool != NULL) {
        ngx_destroy_pool(ctx->pool);
    }
    ctx->pool = NULL;

    ngx_memzero(ctx, sizeof(*ctx));

    if (parser != NULL) {
        ngx_free(parser);
        parser = NULL;
    }

    if (upsync_server->upsync_ev.timer_set) {
        ngx_del_timer(&upsync_server->upsync_ev);
    }

    ngx_http_upsync_connect_handler(event);
}